

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O2

void VerifyGraph(State *state)

{
  Node *pNVar1;
  _Hash_node_base _Var2;
  Test *pTVar3;
  bool condition;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> _Var4;
  Edge *pEVar5;
  pointer ppNVar6;
  __node_base *p_Var7;
  pointer ppEVar8;
  set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_> edge_set;
  set<const_Edge_*,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_> node_edge_set;
  
  for (ppEVar8 = (state->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar8 !=
      (state->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar8 = ppEVar8 + 1) {
    testing::Test::Check
              (g_current_test,
               ((*ppEVar8)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start !=
               ((*ppEVar8)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/test.cc",0x75,
               "(*e)->outputs_.empty()");
    pEVar5 = *ppEVar8;
    for (ppNVar6 = (pEVar5->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start; pTVar3 = g_current_test,
        ppNVar6 !=
        (pEVar5->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar6 = ppNVar6 + 1) {
      pNVar1 = *ppNVar6;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<Edge*const*,std::vector<Edge*,std::allocator<Edge*>>>,__gnu_cxx::__ops::_Iter_equals_val<Edge*const>>
                        ((pNVar1->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (pNVar1->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,ppEVar8);
      testing::Test::Check
                (pTVar3,_Var4._M_current !=
                        (pNVar1->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/test.cc",
                 0x7b,"find(out_edges.begin(), out_edges.end(), *e) != out_edges.end()");
      pEVar5 = *ppEVar8;
    }
    for (ppNVar6 = (pEVar5->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppNVar6 !=
        (pEVar5->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar6 = ppNVar6 + 1) {
      testing::Test::Check
                (g_current_test,(*ppNVar6)->in_edge_ == pEVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/test.cc",
                 0x80,"(*out_node)->in_edge() == *e");
      pEVar5 = *ppEVar8;
    }
  }
  node_edge_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_edge_set._M_t._M_impl.super__Rb_tree_header._M_header;
  node_edge_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_edge_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_edge_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = &(state->paths_)._M_h._M_before_begin;
  node_edge_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_edge_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    _Var2._M_nxt = p_Var7[3]._M_nxt;
    if (_Var2._M_nxt[7]._M_nxt != (_Hash_node_base *)0x0) {
      edge_set._M_t._M_impl._0_8_ = _Var2._M_nxt[7]._M_nxt;
      std::
      _Rb_tree<Edge_const*,Edge_const*,std::_Identity<Edge_const*>,std::less<Edge_const*>,std::allocator<Edge_const*>>
      ::_M_insert_unique<Edge_const*>
                ((_Rb_tree<Edge_const*,Edge_const*,std::_Identity<Edge_const*>,std::less<Edge_const*>,std::allocator<Edge_const*>>
                  *)&node_edge_set,(Edge **)&edge_set);
    }
    std::
    _Rb_tree<Edge_const*,Edge_const*,std::_Identity<Edge_const*>,std::less<Edge_const*>,std::allocator<Edge_const*>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<Edge*const*,std::vector<Edge*,std::allocator<Edge*>>>>
              ((_Rb_tree<Edge_const*,Edge_const*,std::_Identity<Edge_const*>,std::less<Edge_const*>,std::allocator<Edge_const*>>
                *)&node_edge_set,
               (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
               _Var2._M_nxt[8]._M_nxt,
               (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
               _Var2._M_nxt[9]._M_nxt);
  }
  std::set<Edge_const*,std::less<Edge_const*>,std::allocator<Edge_const*>>::
  set<__gnu_cxx::__normal_iterator<Edge*const*,std::vector<Edge*,std::allocator<Edge*>>>>
            ((set<Edge_const*,std::less<Edge_const*>,std::allocator<Edge_const*>> *)&edge_set,
             (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             (state->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             (state->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pTVar3 = g_current_test;
  condition = std::operator==(&node_edge_set._M_t,&edge_set._M_t);
  testing::Test::Check
            (pTVar3,condition,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/test.cc",0x8e,
             "node_edge_set == edge_set");
  std::
  _Rb_tree<const_Edge_*,_const_Edge_*,_std::_Identity<const_Edge_*>,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_>
  ::~_Rb_tree(&edge_set._M_t);
  std::
  _Rb_tree<const_Edge_*,_const_Edge_*,_std::_Identity<const_Edge_*>,_std::less<const_Edge_*>,_std::allocator<const_Edge_*>_>
  ::~_Rb_tree(&node_edge_set._M_t);
  return;
}

Assistant:

void VerifyGraph(const State& state) {
  for (vector<Edge*>::const_iterator e = state.edges_.begin();
       e != state.edges_.end(); ++e) {
    // All edges need at least one output.
    EXPECT_FALSE((*e)->outputs_.empty());
    // Check that the edge's inputs have the edge as out-edge.
    for (vector<Node*>::const_iterator in_node = (*e)->inputs_.begin();
         in_node != (*e)->inputs_.end(); ++in_node) {
      const vector<Edge*>& out_edges = (*in_node)->out_edges();
      EXPECT_NE(find(out_edges.begin(), out_edges.end(), *e),
                out_edges.end());
    }
    // Check that the edge's outputs have the edge as in-edge.
    for (vector<Node*>::const_iterator out_node = (*e)->outputs_.begin();
         out_node != (*e)->outputs_.end(); ++out_node) {
      EXPECT_EQ((*out_node)->in_edge(), *e);
    }
  }

  // The union of all in- and out-edges of each nodes should be exactly edges_.
  set<const Edge*> node_edge_set;
  for (State::Paths::const_iterator p = state.paths_.begin();
       p != state.paths_.end(); ++p) {
    const Node* n = p->second;
    if (n->in_edge())
      node_edge_set.insert(n->in_edge());
    node_edge_set.insert(n->out_edges().begin(), n->out_edges().end());
  }
  set<const Edge*> edge_set(state.edges_.begin(), state.edges_.end());
  EXPECT_EQ(node_edge_set, edge_set);
}